

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlVErrMemory(xmlValidCtxtPtr ctxt,char *extra)

{
  long lVar1;
  long delta;
  void *data;
  xmlParserCtxtPtr pctxt;
  xmlGenericErrorFunc channel;
  char *extra_local;
  xmlValidCtxtPtr ctxt_local;
  
  pctxt = (xmlParserCtxtPtr)0x0;
  data = (void *)0x0;
  delta = 0;
  if (ctxt != (xmlValidCtxtPtr)0x0) {
    pctxt = (xmlParserCtxtPtr)ctxt->error;
    delta = (long)ctxt->userData;
    if ((((ctxt->flags & 2) != 0) && (lVar1 = (long)ctxt - (long)ctxt->userData, 0 < lVar1)) &&
       (lVar1 < 0xfa)) {
      data = ctxt->userData;
    }
  }
  if (extra == (char *)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)pctxt,(void *)delta,data,
                    (void *)0x0,0x17,2,XML_ERR_FATAL,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"Memory allocation failed\n");
  }
  else {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)pctxt,(void *)delta,data,
                    (void *)0x0,0x17,2,XML_ERR_FATAL,(char *)0x0,0,extra,(char *)0x0,(char *)0x0,0,0
                    ,"Memory allocation failed : %s\n",extra);
  }
  return;
}

Assistant:

static void
xmlVErrMemory(xmlValidCtxtPtr ctxt, const char *extra)
{
    xmlGenericErrorFunc channel = NULL;
    xmlParserCtxtPtr pctxt = NULL;
    void *data = NULL;

    if (ctxt != NULL) {
        channel = ctxt->error;
        data = ctxt->userData;
	/* Look up flag to detect if it is part of a parsing
	   context */
	if (ctxt->flags & XML_VCTXT_USE_PCTXT) {
	    long delta = (char *) ctxt - (char *) ctxt->userData;
	    if ((delta > 0) && (delta < 250))
		pctxt = ctxt->userData;
	}
    }
    if (extra)
        __xmlRaiseError(NULL, channel, data,
                        pctxt, NULL, XML_FROM_VALID, XML_ERR_NO_MEMORY,
                        XML_ERR_FATAL, NULL, 0, extra, NULL, NULL, 0, 0,
                        "Memory allocation failed : %s\n", extra);
    else
        __xmlRaiseError(NULL, channel, data,
                        pctxt, NULL, XML_FROM_VALID, XML_ERR_NO_MEMORY,
                        XML_ERR_FATAL, NULL, 0, NULL, NULL, NULL, 0, 0,
                        "Memory allocation failed\n");
}